

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O0

void __thiscall
Assimp::COBImporter::ReadUnit_Ascii
          (COBImporter *this,Scene *out,LineSplitter *splitter,ChunkInfo *nfo)

{
  LineSplitter *this_00;
  bool bVar1;
  Logger *pLVar2;
  basic_formatter *pbVar3;
  element_type *peVar4;
  char *in;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar5;
  float local_5a4;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  string local_3e8;
  byte local_3c2;
  byte local_3c1;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  string local_248;
  uint local_224;
  __shared_ptr_access<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Stack_220;
  uint t;
  shared_ptr<Assimp::COB::Node> *nd;
  iterator __end1;
  iterator __begin1;
  NodeList *__range1;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  string local_48;
  ChunkInfo *local_28;
  ChunkInfo *nfo_local;
  LineSplitter *splitter_local;
  Scene *out_local;
  COBImporter *this_local;
  
  local_28 = nfo;
  nfo_local = (ChunkInfo *)splitter;
  splitter_local = (LineSplitter *)out;
  out_local = (Scene *)this;
  if (nfo->version < 2) {
    LineSplitter::operator++(splitter);
    bVar1 = LineSplitter::match_start((LineSplitter *)nfo_local,"Units ");
    this_00 = splitter_local;
    if (bVar1) {
      std::
      deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
      ::begin((iterator *)&__end1._M_node,
              (deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
               *)splitter_local);
      std::
      deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
      ::end((iterator *)&nd,
            (deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
             *)this_00);
      while (bVar1 = std::operator!=((_Self *)&__end1._M_node,(_Self *)&nd), bVar1) {
        p_Stack_220 = (__shared_ptr_access<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)std::
                         _Deque_iterator<std::shared_ptr<Assimp::COB::Node>,_std::shared_ptr<Assimp::COB::Node>_&,_std::shared_ptr<Assimp::COB::Node>_*>
                         ::operator*((_Deque_iterator<std::shared_ptr<Assimp::COB::Node>,_std::shared_ptr<Assimp::COB::Node>_&,_std::shared_ptr<Assimp::COB::Node>_*>
                                      *)&__end1._M_node);
        peVar4 = std::
                 __shared_ptr_access<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Stack_220);
        if ((peVar4->super_ChunkInfo).id == local_28->parent_id) {
          in = LineSplitter::operator[]((LineSplitter *)nfo_local,1);
          local_224 = strtoul10(in,(char **)0x0);
          local_3c1 = 0;
          local_3c2 = 0;
          if (local_224 < 8) {
            local_5a4 = units[local_224];
          }
          else {
            pLVar2 = DefaultLogger::get();
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<unsigned_int>(&local_3c0,&local_224);
            local_3c1 = 1;
            pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                     Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                     operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                               &local_3c0,
                               (char (*) [61])
                               " is not a valid value for `Units` attribute in `Unit chunk` ");
            pbVar3 = (basic_formatter *)
                     Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                     operator_(pbVar5,&local_28->id);
            Formatter::basic_formatter::operator_cast_to_string(&local_248,pbVar3);
            local_3c2 = 1;
            Logger::warn(pLVar2,&local_248);
            local_5a4 = 1.0;
          }
          peVar4 = std::
                   __shared_ptr_access<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->(p_Stack_220);
          peVar4->unit_scale = local_5a4;
          if ((local_3c2 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_248);
          }
          if ((local_3c1 & 1) == 0) {
            return;
          }
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          ~basic_formatter(&local_3c0);
          return;
        }
        std::
        _Deque_iterator<std::shared_ptr<Assimp::COB::Node>,_std::shared_ptr<Assimp::COB::Node>_&,_std::shared_ptr<Assimp::COB::Node>_*>
        ::operator++((_Deque_iterator<std::shared_ptr<Assimp::COB::Node>,_std::shared_ptr<Assimp::COB::Node>_&,_std::shared_ptr<Assimp::COB::Node>_*>
                      *)&__end1._M_node);
      }
      pLVar2 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[14]>(&local_560,(char (*) [14])0xbc4231);
      pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         &local_560,&local_28->id);
      pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_(pbVar5,(char (*) [16])" is a child of ");
      pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_(pbVar5,&local_28->parent_id);
      pbVar3 = (basic_formatter *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_(pbVar5,(char (*) [22])" which does not exist");
      Formatter::basic_formatter::operator_cast_to_string(&local_3e8,pbVar3);
      Logger::warn(pLVar2,&local_3e8);
      std::__cxx11::string::~string((string *)&local_3e8);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_560);
    }
    else {
      pLVar2 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[39]>(&local_1c0,(char (*) [39])"Expected `Units` line in `Unit` chunk ");
      pbVar3 = (basic_formatter *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         &local_1c0,&local_28->id);
      Formatter::basic_formatter::operator_cast_to_string(&local_48,pbVar3);
      Logger::warn(pLVar2,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_1c0);
    }
  }
  else {
    UnsupportedChunk_Ascii(this,splitter,nfo,"Unit");
  }
  return;
}

Assistant:

void COBImporter::ReadUnit_Ascii(Scene& out, LineSplitter& splitter, const ChunkInfo& nfo)
{
    if(nfo.version > 1) {
        return UnsupportedChunk_Ascii(splitter,nfo,"Unit");
    }
    ++splitter;
    if (!splitter.match_start("Units ")) {
        ASSIMP_LOG_WARN_F( "Expected `Units` line in `Unit` chunk ", nfo.id);
        return;
    }

    // parent chunks preceede their childs, so we should have the
    // corresponding chunk already.
    for(std::shared_ptr< Node >& nd : out.nodes) {
        if (nd->id == nfo.parent_id) {
            const unsigned int t=strtoul10(splitter[1]);

            nd->unit_scale = t>=sizeof(units)/sizeof(units[0])?(
                ASSIMP_LOG_WARN_F(t, " is not a valid value for `Units` attribute in `Unit chunk` ", nfo.id)
                ,1.f):units[t];
            return;
        }
    }
    ASSIMP_LOG_WARN_F( "`Unit` chunk ", nfo.id, " is a child of ", nfo.parent_id, " which does not exist");
}